

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScriptGenerator.cxx
# Opt level: O0

void __thiscall
cmScriptGenerator::GenerateScriptActionsPerConfig(cmScriptGenerator *this,ostream *os,Indent indent)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  cmScriptGeneratorIndent cVar5;
  ostream *poVar6;
  char *pcVar7;
  undefined1 local_68 [8];
  string config_test;
  string *cfgType;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool first;
  ostream *os_local;
  cmScriptGenerator *this_local;
  Indent indent_local;
  
  this_local._4_4_ = indent.Level;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this->ConfigurationTypes);
  if (bVar2) {
    GenerateScriptActionsOnce(this,os,this_local._4_4_);
  }
  else {
    bVar2 = true;
    this_00 = this->ConfigurationTypes;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    cfgType = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&cfgType), bVar3) {
      config_test.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      bVar3 = GeneratesForConfig(this,(string *)config_test.field_2._8_8_);
      if (bVar3) {
        CreateConfigTest((string *)local_68,this,(string *)config_test.field_2._8_8_);
        poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
        pcVar7 = "elseif(";
        if (bVar2) {
          pcVar7 = "if(";
        }
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6,(string *)local_68);
        std::operator<<(poVar6,")\n");
        uVar1 = config_test.field_2._8_8_;
        cVar5 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
        (*this->_vptr_cmScriptGenerator[5])(this,os,uVar1,(ulong)(uint)cVar5.Level);
        bVar2 = false;
        std::__cxx11::string::~string((string *)local_68);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if (!bVar2) {
      uVar4 = (*this->_vptr_cmScriptGenerator[7])();
      if ((uVar4 & 1) != 0) {
        poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
        std::operator<<(poVar6,"else()\n");
        cVar5 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
        (*this->_vptr_cmScriptGenerator[6])(this,os,(ulong)(uint)cVar5.Level);
      }
      poVar6 = ::operator<<(os,(cmScriptGeneratorIndent)this_local._4_4_);
      std::operator<<(poVar6,"endif()\n");
    }
  }
  return;
}

Assistant:

void cmScriptGenerator::GenerateScriptActionsPerConfig(std::ostream& os,
                                                       Indent indent)
{
  if (this->ConfigurationTypes->empty()) {
    // In a single-configuration generator there is only one action
    // and it applies if the runtime-requested configuration is among
    // the rule's allowed configurations.  The configuration built in
    // the tree does not matter for this decision but will be used to
    // generate proper target file names into the code.
    this->GenerateScriptActionsOnce(os, indent);
  } else {
    // In a multi-configuration generator we produce a separate rule
    // in a block for each configuration that is built.  We restrict
    // the list of configurations to those to which this rule applies.
    bool first = true;
    for (std::string const& cfgType : *this->ConfigurationTypes) {
      if (this->GeneratesForConfig(cfgType)) {
        // Generate a per-configuration block.
        std::string config_test = this->CreateConfigTest(cfgType);
        os << indent << (first ? "if(" : "elseif(") << config_test << ")\n";
        this->GenerateScriptForConfig(os, cfgType, indent.Next());
        first = false;
      }
    }
    if (!first) {
      if (this->NeedsScriptNoConfig()) {
        os << indent << "else()\n";
        this->GenerateScriptNoConfig(os, indent.Next());
      }
      os << indent << "endif()\n";
    }
  }
}